

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginElemSegment
          (BinaryReaderInterp *this,Index index,Index table_index,uint8_t flags)

{
  Result RVar1;
  SegmentKind kind;
  ElemDesc desc;
  Var local_70;
  
  kind = Declared;
  if ((~(uint)flags & 3) != 0) {
    kind = flags & Passive;
  }
  desc.elements.super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  desc.elements.super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  desc.type.enum_ = Any;
  desc.elements.super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  desc.elements.super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  desc.elements.super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  Var::Var(&local_70,table_index,(Location *)&desc);
  RVar1 = SharedValidator::OnElemSegment
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70,kind);
  Var::~Var(&local_70);
  if (RVar1.enum_ != Error) {
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    desc.type.enum_ = Void;
    desc.mode = kind;
    desc.table_index = table_index;
    std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::push_back
              (&this->module_->elems,&desc);
    (this->init_expr_).kind = None;
    std::_Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
    ~_Vector_base((_Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_> *)
                  &desc);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginElemSegment(Index index,
                                            Index table_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnElemSegment(loc, Var(table_index), mode));

  ElemDesc desc;
  desc.type = ValueType::Void;  // Initialized later in OnElemSegmentElemType.
  desc.mode = mode;
  desc.table_index = table_index;
  module_.elems.push_back(desc);
  init_expr_.kind = InitExprKind::None;
  return Result::Ok;
}